

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1613(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1c2;
  allocator<char> local_1c1;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1c0;
  string local_1a8;
  SyntaxKind local_188 [8];
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"x ( ( ( y ) ) )",&local_1c1);
  Expectation::Expectation(&local_178);
  local_188[0] = CallExpression;
  local_188[1] = IdentifierName;
  local_188[2] = ParenthesizedExpression;
  local_188[3] = ParenthesizedExpression;
  local_188[4] = 0x432;
  __l._M_len = 5;
  __l._M_array = local_188;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1c0,__l,
             &local_1c2);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1c0);
  Expectation::Expectation(&local_c0,pEVar1);
  parseExpression(this,&local_1a8,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1c0);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

void ParserTester::case1613()
{
    parseExpression("x ( ( ( y ) ) )",
                    Expectation().AST( { SyntaxKind::CallExpression,
                                         SyntaxKind::IdentifierName,
                                         SyntaxKind::ParenthesizedExpression,
                                         SyntaxKind::ParenthesizedExpression,
                                         SyntaxKind::IdentifierName }));
}